

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

double units::detail::convertFlaggedUnits<units::unit,units::unit>
                 (double val,unit *start,unit *result,double basis)

{
  float fVar1;
  unit_data uVar2;
  bool bVar3;
  double dVar4;
  unit uStack_18;
  
  uVar2 = start->base_units_;
  if ((((uint)uVar2 & 0x4fffffff) == 0x40010000) ||
     (((uint)result->base_units_ & 0x4fffffff) == 0x40010000)) {
    if (((uint)start->base_units_ & 0x4fffffff) == 0x40010000) {
      uStack_18 = *start;
      bVar3 = unit::operator==((unit *)&degF,&uStack_18);
      if (bVar3) {
        val = ((val + -32.0) * 5.0) / 9.0;
      }
      else {
        fVar1 = start->multiplier_;
        if ((fVar1 != 1.0) || (NAN(fVar1))) {
          if ((29.5 <= fVar1) || (fVar1 < 0.0)) {
            val = val * (double)fVar1;
          }
          else {
            val = val * (double)fVar1 +
                  convertTemperature<units::unit,_units::unit>::biasTable._M_elems[(int)fVar1];
          }
        }
      }
      dVar4 = val + 273.15;
    }
    else {
      dVar4 = val * (double)start->multiplier_;
    }
    if (((uint)result->base_units_ & 0x4fffffff) == 0x40010000) {
      dVar4 = dVar4 + -273.15;
      uStack_18 = *result;
      bVar3 = unit::operator==((unit *)&degF,&uStack_18);
      if (bVar3) {
        dVar4 = dVar4 * 1.8 + 32.0;
      }
      else {
        fVar1 = result->multiplier_;
        if ((fVar1 != 1.0) || (NAN(fVar1))) {
          if ((fVar1 < 29.5) && (0.0 <= fVar1)) {
            dVar4 = dVar4 - convertTemperature<units::unit,_units::unit>::biasTable._M_elems
                            [(int)fVar1];
          }
          dVar4 = dVar4 / (double)fVar1;
        }
      }
    }
    else {
      dVar4 = dVar4 / (double)result->multiplier_;
    }
    return dVar4;
  }
  if (((uint)uVar2 & 0xfffffff) != 0x1ef) {
    return NAN;
  }
  if ((((uint)result->base_units_ ^ (uint)uVar2) >> 0x1e & 1) != 0) {
    if (((uint)uVar2 >> 0x1e & 1) == 0) {
      if (NAN(basis)) {
        return (val * (double)start->multiplier_ + -101325.0) / (double)result->multiplier_;
      }
      return ((double)start->multiplier_ * val) / (double)result->multiplier_ - basis;
    }
    if (NAN(basis)) {
      return (val * (double)start->multiplier_ + 101325.0) / (double)result->multiplier_;
    }
    val = val + basis;
  }
  return ((double)start->multiplier_ * val) / (double)result->multiplier_;
}

Assistant:

constexpr bool equivalent_non_counting(const unit_data& other) const
        {
            return meter_ == other.meter_ && second_ == other.second_ &&
                kilogram_ == other.kilogram_ && ampere_ == other.ampere_ &&
                candela_ == other.candela_ && kelvin_ == other.kelvin_ &&
                currency_ == other.currency_;
        }